

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::GLMClassifier_DoubleArray::SerializeWithCachedSizes
          (GLMClassifier_DoubleArray *this,CodedOutputStream *output)

{
  int iVar1;
  RepeatedField<double> *this_00;
  double *a;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  GLMClassifier_DoubleArray *this_local;
  
  iVar1 = value_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_value_cached_byte_size_);
    this_00 = value(this);
    a = google::protobuf::RepeatedField<double>::data(this_00);
    iVar1 = value_size(this);
    google::protobuf::internal::WireFormatLite::WriteDoubleArray(a,iVar1,output);
  }
  return;
}

Assistant:

void GLMClassifier_DoubleArray::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.GLMClassifier.DoubleArray)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated double value = 1;
  if (this->value_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_value_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->value().data(), this->value_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.GLMClassifier.DoubleArray)
}